

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

void qpdf_set_info_key(qpdf_data qpdf,char *key,char *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  QPDFObjectHandle *oh;
  undefined8 uVar2;
  bool bVar3;
  size_t sVar4;
  QPDFObjectHandle trailer;
  QPDFObjectHandle value_object;
  QPDFObjectHandle info;
  string local_88;
  string local_68;
  QPDFObjectHandle local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if ((key != (char *)0x0) && (*key == '/')) {
    local_68.field_2._M_allocated_capacity = 0;
    local_68.field_2._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (value == (char *)0x0) {
      QPDFObjectHandle::newNull();
      uVar2 = local_68.field_2._8_8_;
      local_68.field_2._8_8_ = local_88._M_string_length;
      local_68.field_2._M_allocated_capacity = (size_type)local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      sVar4 = strlen(value);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,value,value + sVar4);
      QPDFObjectHandle::newString((QPDFObjectHandle *)&local_68,&local_88);
      uVar2 = local_68.field_2._8_8_;
      local_68.field_2._8_8_ = local_68._M_string_length;
      local_68.field_2._M_allocated_capacity = (size_type)local_68._M_dataplus._M_p;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    QPDF::getTrailer((qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    paVar1 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Info","");
    bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)&local_68,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (!bVar3) {
      local_88._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Info","");
      oh = (QPDFObjectHandle *)
           (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      QPDFObjectHandle::newDictionary();
      QPDF::makeIndirectObject((QPDF *)&local_48,oh);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&local_68,&local_88,&local_48);
      if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    local_88._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"/Info","");
    QPDFObjectHandle::getKey(&local_48,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    local_88._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = strlen(key);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,key,key + sVar4);
    QPDFObjectHandle::replaceKey(&local_48,&local_88,(QPDFObjectHandle *)&local_68.field_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if (local_48.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68.field_2._8_8_);
    }
  }
  return;
}

Assistant:

void
qpdf_set_info_key(qpdf_data qpdf, char const* key, char const* value)
{
    if ((key == nullptr) || (std::strlen(key) == 0) || (key[0] != '/')) {
        return;
    }
    QPDFObjectHandle value_object;
    if (value) {
        QTC::TC("qpdf", "qpdf-c set_info_key to value");
        value_object = QPDFObjectHandle::newString(value);
    } else {
        QTC::TC("qpdf", "qpdf-c set_info_key to null");
        value_object = QPDFObjectHandle::newNull();
    }

    QPDFObjectHandle trailer = qpdf->qpdf->getTrailer();
    if (!trailer.hasKey("/Info")) {
        QTC::TC("qpdf", "qpdf-c add info to trailer");
        trailer.replaceKey(
            "/Info", qpdf->qpdf->makeIndirectObject(QPDFObjectHandle::newDictionary()));
    } else {
        QTC::TC("qpdf", "qpdf-c set-info-key use existing info");
    }

    QPDFObjectHandle info = trailer.getKey("/Info");
    info.replaceKey(key, value_object);
}